

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

Validity * __thiscall
capnp::compiler::CompilerMain::evalConst
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr name)

{
  RawSchema *pRVar1;
  bool bVar2;
  PointerReader reader;
  Reader brand;
  undefined1 auVar3 [40];
  Reader reader_00;
  Field field;
  Reader value_00;
  Reader value_01;
  StringPtr name_00;
  Maybe<kj::_::Mutex::Waiter_&> MVar4;
  char cVar5;
  short sVar6;
  Format FVar7;
  long lVar9;
  ConstSchema constant;
  StructSchema schema_00;
  SegmentReader *params;
  Arena *pAVar10;
  char *pcVar11;
  anon_union_8_2_eba6ea51_for_Type_5 aVar12;
  Reader *extraout_RDX;
  Reader *extraout_RDX_00;
  Reader *extraout_RDX_01;
  Reader *extraout_RDX_02;
  Reader *extraout_RDX_03;
  Reader *extraout_RDX_04;
  Reader *extraout_RDX_05;
  Reader *extraout_RDX_06;
  Reader *extraout_RDX_07;
  Reader *params_00;
  Reader *extraout_RDX_08;
  Reader *extraout_RDX_09;
  Reader *extraout_RDX_10;
  long extraout_RDX_11;
  long extraout_RDX_12;
  RawSchema *pRVar13;
  ProcessContext *pPVar14;
  bool bVar15;
  anon_union_8_2_eba6ea51_for_Type_5 aVar16;
  anon_union_8_2_eba6ea51_for_Type_5 __return_storage_ptr___00;
  anon_union_8_2_eba6ea51_for_Type_5 aVar17;
  Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *p;
  bool bVar18;
  ReaderOptions options;
  StringPtr SVar19;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> nameParts;
  ReaderFor<capnp::DynamicStruct> structValue_1;
  Schema schema;
  StringPtr partName;
  ReaderFor<capnp::DynamicList> listValue;
  Reader value;
  ReaderFor<capnp::DynamicStruct> structValue;
  IteratorInput<char,_const_char_*> input;
  word zeroWord [1];
  SegmentArrayMessageReader emptyMessage;
  ArrayPtr<const_capnp::word> segments [1];
  Fault f;
  undefined8 uVar20;
  bool local_439;
  undefined8 in_stack_fffffffffffffbd8;
  CapTableReader *pCVar21;
  char *in_stack_fffffffffffffbe0;
  SegmentReader *pSVar22;
  Maybe<kj::_::Mutex::Waiter_&> MVar23;
  SegmentReader *pSVar24;
  undefined8 in_stack_fffffffffffffc00;
  undefined1 uVar25;
  Type in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc0c;
  anon_union_64_12_1c583c3a_for_Reader_1 aStack_3f0;
  Schema local_3a8;
  SegmentReader *local_3a0;
  anon_union_8_2_eba6ea51_for_Type_5 local_398;
  anon_union_8_2_eba6ea51_for_Type_5 local_390;
  ReaderFor<DynamicList> local_388;
  Reader local_338;
  anon_union_8_2_eba6ea51_for_Type_5 local_2e8;
  anon_union_8_2_eba6ea51_for_Type_5 local_2e0;
  anon_union_8_2_eba6ea51_for_Type_5 local_2d8;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_2d0;
  undefined8 *local_2c8;
  undefined8 uStack_2c0;
  IteratorInput<char,_const_char_*> local_298;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  CapTableReader *local_248;
  word local_208;
  undefined1 local_200 [16];
  Maybe<kj::_::Mutex::Waiter_&> MStack_1f0;
  SegmentReader *pSStack_1e8;
  bool local_1e0;
  ReaderFor<DynamicStruct> local_120;
  ReaderFor<DynamicList> local_e8;
  ArrayPtr<const_capnp::word> local_a8;
  Sequence_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>,_const_kj::parse::EndOfInput__&>
  local_90;
  int iVar8;
  
  local_298.pos = name.content.ptr;
  if (this->flat == true) {
    FVar7 = this->packed | FLAT;
  }
  else {
    FVar7 = PACKED;
    if (this->packed == false) {
      FVar7 = BINARY;
      if (this->binary == false) {
        FVar7 = this->convertTo;
      }
    }
  }
  this->convertTo = FVar7;
  lVar9 = (long)(this->sourceFiles).builder.pos - (long)(this->sourceFiles).builder.ptr;
  local_200._0_8_ = (lVar9 >> 3) * 0x6db6db6db6db6db7;
  local_200._8_4_ = 1;
  MStack_1f0.ptr = (Waiter *)0x2106c1;
  pSStack_1e8 = (SegmentReader *)0x5;
  local_1e0 = lVar9 == 0x38;
  if (!local_1e0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
              ((Fault *)&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
               ,0x693,FAILED,"sourceFiles.size() == 1","_kjCondition,",
               (DebugComparison<unsigned_long,_int> *)local_200);
    kj::_::Debug::Fault::fatal((Fault *)&local_90);
  }
  local_90.first.subParser.first =
       (Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>
        *)kj::parse::identifier;
  local_90.first.subParser.rest.first.subParser.rest.first =
       (Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>
        *)kj::parse::integer;
  local_90.first.subParser.rest.rest.first.first = (EndOfInput_ *)&kj::parse::endOfInput;
  local_90.first.subParser.rest.rest.first.rest.first.rest.first.subParser =
       (EndOfInput_ *)&kj::parse::endOfInput;
  local_90.rest.first = (EndOfInput_ *)&kj::parse::endOfInput;
  local_298.end = local_298.pos + (name.content.size_ - 1);
  local_298.parent = (IteratorInput<char,_const_char_*> *)0x0;
  pSVar24 = (SegmentReader *)0x0;
  params = (SegmentReader *)0x0;
  MVar23.ptr = (Waiter *)0x0;
  local_298.best = local_298.pos;
  kj::parse::
  Sequence_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'['>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::ExactlyConst_<char,_'x'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,_']'>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'.'>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>,_const_kj::parse::EndOfInput__&>
  ::parseNext<kj::parse::IteratorInput<char,_const_char_*>_>
            ((Maybe<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> *)&local_338,
             &local_90,&local_298);
  uVar25 = (undefined1)local_338.type;
  local_200[0] = (undefined1)local_338.type;
  if ((undefined1)local_338.type == VOID) {
    local_200._8_8_ = local_338.field_1.anyPointerValue.reader.segment;
    MStack_1f0.ptr = (Waiter *)local_338.field_1.textValue.super_StringPtr.content.size_;
    pSStack_1e8 = local_338.field_1.listValue.reader.segment;
    local_338.field_1.intValue = 0;
    local_338.field_1.textValue.super_StringPtr.content.size_ = 0;
    if (params != (SegmentReader *)0x0) {
      (*(code *)pSVar24->arena->_vptr_Arena)
                (pSVar24,params,0x30,MVar23.ptr,MVar23.ptr,
                 kj::ArrayDisposer::Dispose_<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::
                 destruct);
    }
    MVar23.ptr = MStack_1f0.ptr;
    params = (SegmentReader *)local_200._8_8_;
    local_200._8_8_ = (char *)0x0;
    MStack_1f0.ptr = (Waiter *)0x0;
    pSVar24 = pSStack_1e8;
  }
  else {
    kj::heapString((String *)&local_338,"invalid syntax",0xe);
    (__return_storage_ptr__->errorMessage).ptr.isSet = true;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr =
         (char *)CONCAT44(local_338._4_4_,local_338.type);
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ =
         local_338.field_1.intValue;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer =
         (ArrayDisposer *)local_338.field_1.textValue.super_StringPtr.content.size_;
  }
  MVar4.ptr = MStack_1f0.ptr;
  uVar20 = local_200._8_8_;
  if ((local_200[0] == '\x01') && ((char *)local_200._8_8_ != (char *)0x0)) {
    local_200._8_8_ = (char *)0x0;
    MStack_1f0.ptr = (Waiter *)0x0;
    (*(code *)pSStack_1e8->arena->_vptr_Arena)
              (pSStack_1e8,uVar20,0x30,MVar4.ptr,MVar4.ptr,
               kj::ArrayDisposer::Dispose_<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::
               destruct);
  }
  pSVar22 = params;
  if (uVar25 == UNKNOWN) goto LAB_00124dfd;
  pcVar11 = (char *)((this->sourceFiles).builder.ptr)->id;
  if (MVar23.ptr == (Waiter *)0x0) {
    bVar15 = false;
  }
  else {
    bVar15 = false;
    do {
      pAVar10 = (Arena *)0x237f1b;
      if (*(long *)&params->id != 0) {
        pAVar10 = params->arena;
      }
      SVar19.content.size_ = (size_t)pAVar10;
      SVar19.content.ptr = pcVar11;
      Compiler::lookup((Compiler *)local_200,(uint64_t)(this->compiler).ptr,SVar19);
      if (local_200[0] == '\x01') {
        bVar18 = params->readLimiter == (ReadLimiter *)0x0;
        pcVar11 = (char *)local_200._8_8_;
        if (!bVar18) {
          bVar15 = true;
        }
      }
      else {
        bVar18 = false;
      }
    } while ((bVar18) &&
            (params = (SegmentReader *)&params[1].id,
            params != (SegmentReader *)((long)MVar23.ptr * 0x30 + (long)pSVar22)));
  }
  local_258 = 0;
  local_268 = 0;
  uStack_260 = 0;
  local_278 = 0;
  uStack_270 = 0;
  uStack_250 = 0x7fffffff;
  uVar20 = (RawBrandedSchema *)0x0;
  auVar3 = ZEXT1640(ZEXT816(0));
  brand._reader._40_8_ = 0x7fffffff;
  brand._reader.segment = (SegmentReader *)auVar3._0_8_;
  brand._reader.capTable = (CapTableReader *)auVar3._8_8_;
  brand._reader.data = (void *)auVar3._16_8_;
  brand._reader.pointers = (WirePointer *)auVar3._24_8_;
  brand._reader.dataSize = auVar3._32_4_;
  brand._reader.pointerCount = auVar3._36_2_;
  brand._reader._38_2_ = auVar3._38_2_;
  local_3a8 = SchemaLoader::get(&((this->compiler).ptr)->loader,(uint64_t)pcVar11,brand,
                                (Schema)0x28e630);
  local_338.type = UNKNOWN;
  local_a8.ptr = &local_208;
  local_208.content = 0;
  local_a8.size_ = 1;
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  __return_storage_ptr___00.scopeId = 0x40;
  segments_00.size_ = 1;
  segments_00.ptr = &local_a8;
  SegmentArrayMessageReader::SegmentArrayMessageReader
            ((SegmentArrayMessageReader *)local_200,segments_00,options);
  Schema::getProto((Reader *)&stack0xfffffffffffffc08,&local_3a8);
  if (aStack_3f0._24_4_ < 0x70) {
    sVar6 = 0;
  }
  else {
    sVar6 = *(short *)(aStack_3f0.textValue.super_StringPtr.content.size_ + 0xc);
  }
  if (sVar6 == 1) {
    if (params != (SegmentReader *)((long)MVar23.ptr * 0x30 + (long)pSVar22)) {
      schema_00 = Schema::asStruct(&local_3a8);
      MessageReader::getRootInternal((Reader *)&local_2d8,(MessageReader *)local_200);
      reader.capTable = (CapTableReader *)aStack_2d0.schema;
      reader.segment = (SegmentReader *)local_2d8.schema;
      reader.pointer = (WirePointer *)local_2c8;
      reader._24_8_ = uStack_2c0;
      uVar20 = local_2d8;
      capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                ((Reader *)&local_388,reader,schema_00);
      in_stack_fffffffffffffc08 = STRUCT;
      aStack_3f0.intValue =
           CONCAT17(local_388.schema.elementType._7_1_,local_388.schema.elementType._0_7_);
      aStack_3f0.textValue.super_StringPtr.content.size_ =
           CONCAT17(local_388.schema.elementType.field_4.scopeId._7_1_,
                    local_388.schema.elementType.field_4.scopeId._0_7_);
      aStack_3f0.capabilityValue.schema.super_Schema.raw =
           (InterfaceSchema)CONCAT17(local_388.reader.segment._7_1_,local_388.reader.segment._0_7_);
      aStack_3f0.listValue.reader.capTable =
           (CapTableReader *)
           CONCAT17(local_388.reader.capTable._7_1_,local_388.reader.capTable._0_7_);
      aStack_3f0.listValue.reader.ptr =
           (byte *)CONCAT17(local_388.reader.ptr._7_1_,local_388.reader.ptr._0_7_);
      aStack_3f0._40_8_ = CONCAT44(local_388.reader.step,local_388.reader.elementCount);
      aStack_3f0._48_8_ = CONCAT17(local_388.reader._39_1_,local_388.reader._32_7_);
      DynamicValue::Reader::operator=(&local_338,(Reader *)&stack0xfffffffffffffc08);
      DynamicValue::Reader::~Reader((Reader *)&stack0xfffffffffffffc08);
      params_00 = extraout_RDX_00;
      goto LAB_001246dc;
    }
    SVar19 = Schema::getShortDisplayName(&local_3a8);
    local_388.schema.elementType._0_7_ = SVar19.content.ptr._0_7_;
    local_388.schema.elementType._7_1_ = SVar19.content.ptr._7_1_;
    local_388.schema.elementType.field_4.scopeId._0_7_ = SVar19.content.size_._0_7_;
    local_388.schema.elementType.field_4.scopeId._7_1_ = SVar19.content.size_._7_1_;
    kj::str<char_const(&)[2],kj::StringPtr,char_const(&)[23]>
              ((String *)&stack0xfffffffffffffc08,(kj *)0x2223ec,(char (*) [2])&local_388,
               (StringPtr *)"\' cannot be evaluated.",(char (*) [23])&local_388);
  }
  else {
    if (sVar6 == 4) {
      constant = Schema::asConst(&local_3a8);
      DynamicValue::Reader::Reader((Reader *)&stack0xfffffffffffffc08,constant);
      DynamicValue::Reader::operator=(&local_338,(Reader *)&stack0xfffffffffffffc08);
      DynamicValue::Reader::~Reader((Reader *)&stack0xfffffffffffffc08);
      params_00 = extraout_RDX;
LAB_001246dc:
      pCVar21 = (CapTableReader *)in_stack_fffffffffffffbd8;
      if (params != (SegmentReader *)((long)MVar23.ptr * 0x30 + (long)pSVar22)) {
        do {
          lVar9 = *(long *)&(params->id).value;
          pcVar11 = "";
          if (lVar9 != 0) {
            pcVar11 = (char *)params->arena;
          }
          local_390.schema = (RawBrandedSchema *)(lVar9 + (ulong)(lVar9 == 0));
          local_3a0 = params;
          local_398 = (anon_union_8_2_eba6ea51_for_Type_5)pcVar11;
          if (bVar15) {
LAB_00124749:
            local_439 = (__return_storage_ptr__->errorMessage).ptr.isSet;
            bVar18 = params->readLimiter == (ReadLimiter *)0x0;
            if (bVar18) {
              bVar15 = false;
            }
            else {
              in_stack_fffffffffffffbe0 =
                   (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr;
              aVar16.schema = (RawBrandedSchema *)0x0;
              aVar17.scopeId = 1;
              pCVar21 = (CapTableReader *)
                        (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_;
              do {
                in_stack_fffffffffffffbd8 = aStack_3f0.intValue;
                aVar12 = (anon_union_8_2_eba6ea51_for_Type_5)(local_3a0->ptr).size_;
                if (local_338.type != LIST) {
                  (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ =
                       (size_t)pCVar21;
                  (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr =
                       in_stack_fffffffffffffbe0;
                  (__return_storage_ptr__->errorMessage).ptr.isSet = local_439;
                  if ((int)aVar17.scopeId == 1) {
                    kj::str<char_const(&)[2],kj::StringPtr&,char_const(&)[17]>
                              ((String *)&stack0xfffffffffffffc08,(kj *)0x2223ec,
                               (char (*) [2])&local_398,(StringPtr *)0x211bdf,
                               (char (*) [17])__return_storage_ptr___00.schema);
                    (__return_storage_ptr__->errorMessage).ptr.isSet = true;
                    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr =
                         (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08);
                    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ =
                         aStack_3f0.intValue;
                    *(size_t *)((long)&(__return_storage_ptr__->errorMessage).ptr.field_1 + 0x10) =
                         aStack_3f0.textValue.super_StringPtr.content.size_;
                    params_00 = extraout_RDX_06;
                  }
                  else {
                    __return_storage_ptr___00.schema = (RawBrandedSchema *)&local_388;
                    local_2d8 = aVar12;
                    aStack_2d0 = aVar16;
                    kj::strArray<kj::ArrayPtr<unsigned_long>>
                              ((String *)__return_storage_ptr___00.schema,(kj *)&local_2d8,
                               (ArrayPtr<unsigned_long> *)"][",(char *)__return_storage_ptr__);
                    kj::
                    str<char_const(&)[2],kj::StringPtr&,char_const(&)[2],kj::String,char_const(&)[18]>
                              ((String *)&stack0xfffffffffffffc08,(kj *)0x2223ec,
                               (char (*) [2])&local_398,(StringPtr *)0x211bc7,
                               (char (*) [2])__return_storage_ptr___00.schema,
                               (String *)"]\' is not a list.",(char (*) [18])uVar20);
                    (__return_storage_ptr__->errorMessage).ptr.isSet = true;
                    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr =
                         (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08);
                    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ =
                         aStack_3f0.intValue;
                    *(size_t *)((long)&(__return_storage_ptr__->errorMessage).ptr.field_1 + 0x10) =
                         aStack_3f0.textValue.super_StringPtr.content.size_;
                    in_stack_fffffffffffffc08 = UNKNOWN;
                    in_stack_fffffffffffffc0c = 0;
                    aStack_3f0.intValue = 0;
                    lVar9 = CONCAT17(local_388.schema.elementType._7_1_,
                                     local_388.schema.elementType._0_7_);
                    params_00 = extraout_RDX_08;
                    if (lVar9 != 0) {
                      __return_storage_ptr___00.scopeId._7_1_ =
                           local_388.schema.elementType.field_4.scopeId._7_1_;
                      __return_storage_ptr___00.scopeId._0_7_ =
                           local_388.schema.elementType.field_4.scopeId._0_7_;
                      local_388.schema.elementType.baseType = VOID;
                      local_388.schema.elementType.listDepth = '\0';
                      local_388.schema.elementType.isImplicitParam = false;
                      local_388.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0
                      ;
                      local_388.schema.elementType._6_1_ = 0;
                      local_388.schema.elementType._7_1_ = 0;
                      local_388.schema.elementType.field_4.scopeId._0_7_ = 0;
                      local_388.schema.elementType.field_4.scopeId._7_1_ = 0;
                      (*(code *)**(undefined8 **)
                                  CONCAT17(local_388.reader.segment._7_1_,
                                           local_388.reader.segment._0_7_))
                                ((undefined8 *)
                                 CONCAT17(local_388.reader.segment._7_1_,
                                          local_388.reader.segment._0_7_),lVar9,1,
                                 __return_storage_ptr___00.schema,__return_storage_ptr___00.schema,0
                                );
                      params_00 = extraout_RDX_09;
                    }
                  }
                  goto LAB_00124b6a;
                }
                pRVar1 = (&(aVar12.schema)->generic)[aVar16.scopeId];
                DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
                          (&local_388,&local_338);
                pRVar13 = (RawSchema *)(ulong)local_388.reader.elementCount;
                if (pRVar1 < pRVar13) {
                  DynamicList::Reader::operator[]
                            ((Reader *)&stack0xfffffffffffffc08,&local_388,(uint)pRVar1);
                  DynamicValue::Reader::operator=(&local_338,(Reader *)&stack0xfffffffffffffc08);
                  DynamicValue::Reader::~Reader((Reader *)&stack0xfffffffffffffc08);
                  params_00 = extraout_RDX_01;
                  in_stack_fffffffffffffbd8 = pCVar21;
                }
                else {
                  local_2e8 = (anon_union_8_2_eba6ea51_for_Type_5)(local_3a0->ptr).size_;
                  __return_storage_ptr___00.schema = (RawBrandedSchema *)&local_2d8;
                  local_2e0 = aVar17;
                  kj::strArray<kj::ArrayPtr<unsigned_long>>
                            ((String *)__return_storage_ptr___00.schema,(kj *)&local_2e8,
                             (ArrayPtr<unsigned_long> *)"][",pcVar11);
                  kj::
                  str<char_const(&)[2],kj::StringPtr&,char_const(&)[2],kj::String,char_const(&)[21]>
                            ((String *)&stack0xfffffffffffffc08,(kj *)0x2223ec,
                             (char (*) [2])&local_398,(StringPtr *)0x211bc7,
                             (char (*) [2])__return_storage_ptr___00.schema,
                             (String *)"]\' is out-of-bounds.",(char (*) [21])uVar20);
                  aVar12 = aStack_2d0;
                  aVar16 = local_2d8;
                  in_stack_fffffffffffffbe0 =
                       (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08);
                  *(size_t *)((long)&(__return_storage_ptr__->errorMessage).ptr.field_1 + 0x10) =
                       aStack_3f0.textValue.super_StringPtr.content.size_;
                  in_stack_fffffffffffffc08 = UNKNOWN;
                  in_stack_fffffffffffffc0c = 0;
                  aStack_3f0.intValue = 0;
                  pcVar11 = (char *)__return_storage_ptr__;
                  params_00 = extraout_RDX_02;
                  if (local_2d8.schema != (RawBrandedSchema *)0x0) {
                    local_2d8.schema = (RawBrandedSchema *)0x0;
                    aStack_2d0.schema = (RawBrandedSchema *)0x0;
                    __return_storage_ptr___00 = aVar12;
                    (**(code **)*local_2c8)(local_2c8,aVar16.schema,1,aVar12.schema,aVar12.schema,0)
                    ;
                    pcVar11 = (char *)aVar12;
                    params_00 = extraout_RDX_03;
                  }
                  local_439 = true;
                }
                if (pRVar13 <= pRVar1) goto LAB_00124aec;
                aVar12._0_4_ = (int)aVar17.scopeId + 1;
                aVar12.scopeId._4_4_ = 0;
                bVar18 = (anon_union_8_2_eba6ea51_for_Type_5 *)local_3a0->readLimiter <=
                         aVar17.schema;
                bVar2 = aVar17.schema < (anon_union_8_2_eba6ea51_for_Type_5 *)local_3a0->readLimiter
                ;
                aVar16 = aVar17;
                aVar17 = aVar12;
                pCVar21 = (CapTableReader *)in_stack_fffffffffffffbd8;
              } while (bVar2);
              bVar15 = false;
LAB_00124aec:
              (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ =
                   in_stack_fffffffffffffbd8;
              (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr =
                   in_stack_fffffffffffffbe0;
            }
            (__return_storage_ptr__->errorMessage).ptr.isSet = local_439;
            pCVar21 = (CapTableReader *)in_stack_fffffffffffffbd8;
          }
          else {
            if (local_338.type == STRUCT) {
              DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                        ((ReaderFor<DynamicStruct> *)&local_2d8,&local_338);
              local_2e8 = local_2d8;
              name_00.content.size_ = (size_t)local_390.schema;
              name_00.content.ptr = (char *)local_398.schema;
              pcVar11 = (char *)local_390;
              StructSchema::findFieldByName
                        ((Maybe<capnp::StructSchema::Field> *)&stack0xfffffffffffffc08,
                         (StructSchema *)&local_2e8,name_00);
              uVar25 = (undefined1)in_stack_fffffffffffffc08;
              if (uVar25 == VOID) {
                local_388.reader._39_1_ = SUB81(aStack_3f0._48_8_,0);
                local_388.reader._40_7_ = SUB87((ulong)aStack_3f0._48_8_ >> 8,0);
                local_388.reader.ptr._7_1_ = SUB81(aStack_3f0.listValue.reader.ptr,0);
                local_388.reader.elementCount = (ListElementCount)((ulong)aStack_3f0._32_8_ >> 8);
                local_388.reader.step._0_3_ = (undefined3)((ulong)aStack_3f0._32_8_ >> 0x28);
                local_388.reader.step._3_1_ = (undefined1)aStack_3f0._40_8_;
                local_388.reader._32_7_ = SUB87((ulong)aStack_3f0._40_8_ >> 8,0);
                local_388.reader.segment._7_1_ = SUB81(aStack_3f0.listValue.reader.segment,0);
                local_388.reader.capTable._0_7_ = (undefined7)((ulong)aStack_3f0._16_8_ >> 8);
                local_388.reader.capTable._7_1_ = SUB81(aStack_3f0.listValue.reader.capTable,0);
                local_388.reader.ptr._0_7_ = (undefined7)((ulong)aStack_3f0._24_8_ >> 8);
                local_388.schema.elementType._7_1_ = SUB81(aStack_3f0.intValue,0);
                local_388.schema.elementType.field_4.scopeId._0_7_ =
                     (undefined7)((ulong)aStack_3f0._0_8_ >> 8);
                local_388.schema.elementType.field_4.scopeId._7_1_ =
                     (undefined1)aStack_3f0.textValue.super_StringPtr.content.size_;
                local_388.reader.segment._0_7_ = (undefined7)((ulong)aStack_3f0._8_8_ >> 8);
                local_248 = (CapTableReader *)aStack_3f0.intValue;
                field._8_8_ = aStack_3f0.textValue.super_StringPtr.content.size_;
                field.parent.super_Schema.raw = (Schema)(Schema)aStack_3f0.intValue;
                field.proto._reader.segment = aStack_3f0.listValue.reader.segment;
                field.proto._reader.capTable = aStack_3f0.listValue.reader.capTable;
                field.proto._reader.data = aStack_3f0.listValue.reader.ptr;
                field.proto._reader.pointers = (WirePointer *)aStack_3f0._40_8_;
                field.proto._reader.dataSize = aStack_3f0.listValue.reader.structDataSize;
                field.proto._reader.pointerCount = aStack_3f0.listValue.reader.structPointerCount;
                field.proto._reader._38_2_ = aStack_3f0._54_2_;
                field.proto._reader._40_8_ = aStack_3f0._56_8_;
                uVar20 = aStack_3f0.textValue.super_StringPtr.content.ptr;
                DynamicStruct::Reader::get
                          ((Reader *)&stack0xfffffffffffffc08,(Reader *)&local_2d8,field);
                DynamicValue::Reader::operator=(&local_338,(Reader *)&stack0xfffffffffffffc08);
                DynamicValue::Reader::~Reader((Reader *)&stack0xfffffffffffffc08);
                params_00 = extraout_RDX_04;
              }
              else {
                pcVar11 = "\' has no member \'";
                __return_storage_ptr___00.schema = (RawBrandedSchema *)&local_398;
                kj::
                str<char_const(&)[2],kj::String&,char_const(&)[18],kj::StringPtr&,char_const(&)[3]>
                          ((String *)&stack0xfffffffffffffc08,(kj *)0x2223ec,
                           (char (*) [2])&params[-2].readLimiter,(String *)"\' has no member \'",
                           (char (*) [18])__return_storage_ptr___00.schema,(StringPtr *)0x21b1f3,
                           (char (*) [3])uVar20);
                (__return_storage_ptr__->errorMessage).ptr.isSet = true;
                (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr =
                     (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08);
                (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ =
                     aStack_3f0.intValue;
                *(size_t *)((long)&(__return_storage_ptr__->errorMessage).ptr.field_1 + 0x10) =
                     aStack_3f0.textValue.super_StringPtr.content.size_;
                params_00 = extraout_RDX_07;
              }
              pCVar21 = (CapTableReader *)in_stack_fffffffffffffbd8;
              if (uVar25 != UNKNOWN) goto LAB_00124749;
            }
            else {
              kj::str<char_const(&)[2],kj::String&,char_const(&)[19]>
                        ((String *)&stack0xfffffffffffffc08,(kj *)0x2223ec,
                         (char (*) [2])&params[-2].readLimiter,(String *)"\' is not a struct.",
                         (char (*) [19])__return_storage_ptr___00.schema);
              (__return_storage_ptr__->errorMessage).ptr.isSet = true;
              (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr =
                   (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08);
              (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ =
                   aStack_3f0.intValue;
              *(size_t *)((long)&(__return_storage_ptr__->errorMessage).ptr.field_1 + 0x10) =
                   aStack_3f0.textValue.super_StringPtr.content.size_;
              params_00 = extraout_RDX_05;
              pCVar21 = (CapTableReader *)in_stack_fffffffffffffbd8;
            }
            bVar18 = false;
          }
LAB_00124b6a:
          if (!bVar18) goto LAB_00124de3;
          params = (SegmentReader *)&local_3a0[1].id;
          in_stack_fffffffffffffbd8 = pCVar21;
        } while (params != (SegmentReader *)((long)MVar23.ptr * 0x30 + (long)pSVar22));
      }
      if (this->convertTo == TEXT) {
        cVar5 = this->pretty;
        if (((bool)cVar5 != true) || (local_338.type != STRUCT)) goto LAB_00124ff1;
        pPVar14 = this->context;
        DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                  (&local_120,&local_338);
        value_00.reader.segment = (SegmentReader *)pCVar21;
        value_00.schema.super_Schema.raw = (Schema)(Schema)this;
        value_00.reader.capTable = (CapTableReader *)in_stack_fffffffffffffbe0;
        value_00.reader.data = pSVar22;
        value_00.reader.pointers = (WirePointer *)MVar23.ptr;
        value_00.reader._32_8_ = pSVar24;
        value_00.reader._40_8_ = in_stack_fffffffffffffc00;
        prettyPrint(value_00);
        kj::StringTree::flatten((String *)&local_388,(StringTree *)&stack0xfffffffffffffc08);
        lVar9 = CONCAT17(local_388.schema.elementType.field_4.scopeId._7_1_,
                         local_388.schema.elementType.field_4.scopeId._0_7_);
        if (lVar9 == 0) goto LAB_001250d5;
        pcVar11 = (char *)CONCAT17(local_388.schema.elementType._7_1_,
                                   local_388.schema.elementType._0_7_);
LAB_001250dc:
        (*pPVar14->_vptr_ProcessContext[5])(pPVar14,pcVar11,lVar9 + (ulong)(lVar9 == 0));
        lVar9 = extraout_RDX_12;
      }
      else {
        if (local_338.type != STRUCT) {
          kj::heapString((String *)&stack0xfffffffffffffc08,
                         "not a struct; binary output is only available on structs",0x38);
          goto LAB_00124dba;
        }
        DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                  ((ReaderFor<DynamicStruct> *)&stack0xfffffffffffffc08,&local_338);
        (this->rootType).super_Schema.raw =
             (RawBrandedSchema *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08);
        local_388.schema.elementType.baseType = 0xf3e0;
        local_388.schema.elementType.listDepth = '(';
        local_388.schema.elementType.isImplicitParam = false;
        local_388.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
        local_388.schema.elementType._6_1_ = 0;
        local_388.schema.elementType._7_1_ = 0;
        local_388.schema.elementType.field_4.scopeId._0_7_ = 0xffffff00000001;
        local_388.schema.elementType.field_4.scopeId._7_1_ = 0xff;
        reader_00._reader.capTable =
             (CapTableReader *)aStack_3f0.textValue.super_StringPtr.content.size_;
        reader_00._reader.segment = (SegmentReader *)aStack_3f0.intValue;
        reader_00._reader.data = aStack_3f0.listValue.reader.segment;
        reader_00._reader.pointers = (WirePointer *)aStack_3f0.listValue.reader.capTable;
        reader_00._reader._32_8_ = aStack_3f0.listValue.reader.ptr;
        reader_00._reader._40_8_ = aStack_3f0._40_8_;
        writeConversion(this,reader_00,(OutputStream *)&local_388);
        iVar8 = (*this->context->_vptr_ProcessContext[1])();
        cVar5 = (char)iVar8;
        params_00 = extraout_RDX_10;
LAB_00124ff1:
        pPVar14 = this->context;
        if ((cVar5 == '\0') || (local_338.type != LIST)) {
          kj::str<capnp::DynamicValue::Reader&>
                    ((String *)&stack0xfffffffffffffc08,(kj *)&local_338,params_00);
          if (aStack_3f0._0_8_ == (CapTableReader *)0x0) {
            pcVar11 = "";
          }
          else {
            pcVar11 = (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08);
          }
          (*pPVar14->_vptr_ProcessContext[5])
                    (pPVar14,pcVar11,
                     aStack_3f0.textValue.super_StringPtr.content.ptr +
                     (aStack_3f0._0_8_ == (CapTableReader *)0x0));
          lVar9 = extraout_RDX_11;
LAB_001250d5:
          pcVar11 = "";
          goto LAB_001250dc;
        }
        DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
                  (&local_e8,&local_338);
        value_01.schema.elementType.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)pCVar21;
        value_01.schema.elementType._0_8_ = this;
        value_01.reader.segment = (SegmentReader *)in_stack_fffffffffffffbe0;
        value_01.reader.capTable = (CapTableReader *)pSVar22;
        value_01.reader.ptr = (byte *)MVar23.ptr;
        value_01.reader._24_8_ = pSVar24;
        value_01.reader.structDataSize = (int)in_stack_fffffffffffffc00;
        value_01.reader.structPointerCount = (short)((ulong)in_stack_fffffffffffffc00 >> 0x20);
        value_01.reader.elementSize = (char)((ulong)in_stack_fffffffffffffc00 >> 0x30);
        value_01.reader._39_1_ = (char)((ulong)in_stack_fffffffffffffc00 >> 0x38);
        value_01.reader.nestingLimit = in_stack_fffffffffffffc08;
        value_01.reader._44_4_ = in_stack_fffffffffffffc0c;
        prettyPrint(value_01);
        kj::StringTree::flatten((String *)&local_388,(StringTree *)&stack0xfffffffffffffc08);
        lVar9 = CONCAT17(local_388.schema.elementType.field_4.scopeId._7_1_,
                         local_388.schema.elementType.field_4.scopeId._0_7_);
        if (lVar9 != 0) {
          pcVar11 = (char *)CONCAT17(local_388.schema.elementType._7_1_,
                                     local_388.schema.elementType._0_7_);
          goto LAB_001250f4;
        }
      }
      pcVar11 = "";
LAB_001250f4:
      iVar8 = (*pPVar14->_vptr_ProcessContext[5])(pPVar14,pcVar11,lVar9 + (ulong)(lVar9 == 0));
      kj::String::~String((String *)&local_388);
      kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffc08);
      SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_200);
      DynamicValue::Reader::~Reader(&local_338);
      kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::~Array
                ((Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)
                 &stack0xfffffffffffffbe8);
      if (local_298.parent != (IteratorInput<char,_const_char_*> *)0x0) {
        pcVar11 = local_298.best;
        if (local_298.best < local_298.pos) {
          pcVar11 = local_298.pos;
        }
        if (pcVar11 <= (local_298.parent)->best) {
          pcVar11 = (local_298.parent)->best;
        }
        (local_298.parent)->best = pcVar11;
      }
      _Unwind_Resume(iVar8);
    }
    if (bVar15) {
      SVar19 = Schema::getShortDisplayName(&local_3a8);
      local_388.schema.elementType._0_7_ = SVar19.content.ptr._0_7_;
      local_388.schema.elementType._7_1_ = SVar19.content.ptr._7_1_;
      local_388.schema.elementType.field_4.scopeId._0_7_ = SVar19.content.size_._0_7_;
      local_388.schema.elementType.field_4.scopeId._7_1_ = SVar19.content.size_._7_1_;
      kj::str<char_const(&)[2],kj::StringPtr,char_const(&)[17]>
                ((String *)&stack0xfffffffffffffc08,(kj *)0x2223ec,(char (*) [2])&local_388,
                 (StringPtr *)0x211bdf,(char (*) [17])&local_388);
    }
    else if (params == (SegmentReader *)((long)MVar23.ptr * 0x30 + (long)pSVar22)) {
      SVar19 = Schema::getShortDisplayName(&local_3a8);
      local_388.schema.elementType._0_7_ = SVar19.content.ptr._0_7_;
      local_388.schema.elementType._7_1_ = SVar19.content.ptr._7_1_;
      local_388.schema.elementType.field_4.scopeId._0_7_ = SVar19.content.size_._0_7_;
      local_388.schema.elementType.field_4.scopeId._7_1_ = SVar19.content.size_._7_1_;
      kj::str<char_const(&)[2],kj::StringPtr,char_const(&)[23]>
                ((String *)&stack0xfffffffffffffc08,(kj *)0x2223ec,(char (*) [2])&local_388,
                 (StringPtr *)"\' cannot be evaluated.",(char (*) [23])&local_388);
    }
    else {
      kj::str<char_const(&)[2],kj::String&,char_const(&)[18]>
                ((String *)&stack0xfffffffffffffc08,(kj *)0x2223ec,(char (*) [2])params,
                 (String *)"\' is not defined.",(char (*) [18])__return_storage_ptr___00.schema);
    }
  }
LAB_00124dba:
  (__return_storage_ptr__->errorMessage).ptr.isSet = true;
  (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr =
       (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08);
  (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ = aStack_3f0.intValue;
  *(size_t *)((long)&(__return_storage_ptr__->errorMessage).ptr.field_1 + 0x10) =
       aStack_3f0.textValue.super_StringPtr.content.size_;
LAB_00124de3:
  SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_200);
  DynamicValue::Reader::~Reader(&local_338);
LAB_00124dfd:
  if (pSVar22 != (SegmentReader *)0x0) {
    (*(code *)pSVar24->arena->_vptr_Arena)
              (pSVar24,pSVar22,0x30,MVar23.ptr,MVar23.ptr,
               kj::ArrayDisposer::Dispose_<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::
               destruct);
  }
  if (local_298.parent != (IteratorInput<char,_const_char_*> *)0x0) {
    if (local_298.best < local_298.pos) {
      local_298.best = local_298.pos;
    }
    if (local_298.best <= (local_298.parent)->best) {
      local_298.best = (local_298.parent)->best;
    }
    (local_298.parent)->best = local_298.best;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity evalConst(kj::StringPtr name) {
    convertTo = formatFromDeprecatedFlags(convertTo);

    KJ_ASSERT(sourceFiles.size() == 1);

    auto parser = kj::parse::sequence(
        kj::parse::many(
            kj::parse::sequence(
                kj::parse::identifier,
                kj::parse::many(
                    kj::parse::sequence(
                        kj::parse::exactChar<'['>(),
                        kj::parse::integer,
                        kj::parse::exactChar<']'>())),
                kj::parse::oneOf(
                    kj::parse::endOfInput,
                    kj::parse::sequence(
                        kj::parse::exactChar<'.'>(),
                        kj::parse::notLookingAt(kj::parse::endOfInput))))),
        kj::parse::endOfInput);

    kj::parse::IteratorInput<char, const char*> input(name.begin(), name.end());

    kj::Array<kj::Tuple<kj::String, kj::Array<uint64_t>>> nameParts;
    KJ_IF_SOME(p, parser(input)) {
      nameParts = kj::mv(p);
    } else {
      return "invalid syntax";
    }